

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall glcts::BasicBufferState::Run(BasicBufferState *this)

{
  CallLogWrapper *this_00;
  GLboolean GVar1;
  long lVar2;
  long lVar3;
  Buffer buffer;
  
  deqp::GLWrapper::GLWrapper(&buffer.super_GLWrapper);
  buffer.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__Buffer_01df59d0;
  buffer.size_ = 0;
  buffer.usage_ = 0x88e4;
  buffer.access_ = 0x88b9;
  buffer.access_flags_ = 0;
  buffer.mapped_ = '\0';
  this_00 = &buffer.super_GLWrapper.super_CallLogWrapper;
  buffer.map_pointer_ = (void *)0x0;
  buffer.map_offset_ = 0;
  buffer.map_length_ = 0;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&buffer.name_);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,buffer.name_);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,buffer.name_);
  lVar2 = glcts::anon_unknown_0::Buffer::Verify(&buffer);
  lVar3 = -1;
  if (lVar2 == 0) {
    buffer.size_ = 100;
    buffer.usage_ = 0x88ea;
    glu::CallLogWrapper::glBufferData(this_00,0x92c0,100,(void *)0x0,0x88ea);
    lVar2 = glcts::anon_unknown_0::Buffer::Verify(&buffer);
    if (lVar2 == 0) {
      if (buffer.mapped_ != '\0') {
        __assert_fail("mapped_ == GL_FALSE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cShaderAtomicCountersTests.cpp"
                      ,0x2c3,
                      "void *glcts::(anonymous namespace)::Buffer::MapRange(GLintptr, GLsizeiptr, GLbitfield)"
                     );
      }
      buffer.map_pointer_ = glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,10,0x32,2);
      if (buffer.map_pointer_ != (void *)0x0) {
        buffer.map_offset_ = 10;
        buffer.map_length_ = 0x32;
        buffer.access_ = 0x88b9;
        buffer.access_flags_ = 2;
        buffer.mapped_ = '\x01';
      }
      lVar2 = glcts::anon_unknown_0::Buffer::Verify(&buffer);
      if (lVar2 == 0) {
        if (buffer.mapped_ != '\x01') {
          __assert_fail("mapped_ == GL_TRUE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cShaderAtomicCountersTests.cpp"
                        ,0x2d5,"GLboolean glcts::(anonymous namespace)::Buffer::Unmap()");
        }
        GVar1 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
        if (GVar1 != '\0') {
          buffer.mapped_ = '\0';
          buffer.map_pointer_ = (void *)0x0;
          buffer.map_offset_ = 0;
          buffer.map_length_ = 0;
          buffer.access_ = 0x88b9;
          buffer.access_flags_ = 0;
        }
        lVar3 = glcts::anon_unknown_0::Buffer::Verify(&buffer);
        lVar3 = -(ulong)(lVar3 != 0);
      }
    }
  }
  glcts::anon_unknown_0::Buffer::~Buffer(&buffer);
  return lVar3;
}

Assistant:

virtual long Run()
	{
		Buffer buffer;
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer.name());

		if (buffer.Verify() != NO_ERROR)
			return ERROR;

		buffer.Data(100, NULL, GL_DYNAMIC_COPY);
		if (buffer.Verify() != NO_ERROR)
			return ERROR;

		buffer.MapRange(10, 50, GL_MAP_WRITE_BIT);
		if (buffer.Verify() != NO_ERROR)
			return ERROR;
		buffer.Unmap();
		if (buffer.Verify() != NO_ERROR)
			return ERROR;

		return NO_ERROR;
	}